

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O1

void __thiscall
pfederc::Parser::parseCapabilityEnsure
          (Parser *this,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *requires,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *ensures)

{
  Token *pTVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  pointer *__ptr;
  char cVar7;
  Lexer *pLVar8;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_58 [2];
  pointer local_48;
  
  sanityExpect(this,TOK_ENSURE);
  pLVar8 = this->lexer;
  pTVar1 = pLVar8->currentToken;
  bVar4 = Token::operator!=(pTVar1,TOK_ID);
  if (bVar4) {
    cVar7 = '\0';
  }
  else {
    (*pTVar1->_vptr_Token[2])(local_58,pTVar1,pLVar8);
    iVar5 = std::__cxx11::string::compare((char *)local_58);
    if (iVar5 == 0) {
      cVar7 = '\x01';
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)local_58);
      cVar7 = (iVar5 == 0) * '\x02';
    }
    if (local_58[0]._M_head_impl != (Expr *)&local_48) {
      operator_delete(local_58[0]._M_head_impl,
                      (ulong)((long)&(local_48->_M_t).
                                     super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                                     .
                                     super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>
                                     ._M_head_impl + 1));
    }
  }
  if (cVar7 == '\0') {
    pTVar1 = this->lexer->currentToken;
    local_58[0]._M_head_impl = (Expr *)operator_new(0x38);
    sVar3 = (pTVar1->pos).line;
    pLVar8 = (Lexer *)(pTVar1->pos).startIndex;
    sVar2 = (pTVar1->pos).endIndex;
    *(Level *)&(local_58[0]._M_head_impl)->_vptr_Expr = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&(local_58[0]._M_head_impl)->_vptr_Expr + 4) =
         STX_ERR_INVALID_CAPS_ENSURE;
    ((Position *)&(local_58[0]._M_head_impl)->parent)->line = sVar3;
    (local_58[0]._M_head_impl)->lexer = pLVar8;
    *(size_t *)&(local_58[0]._M_head_impl)->type = sVar2;
    (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
     &((local_58[0]._M_head_impl)->pos).line)->_M_impl).super__Vector_impl_data._M_start =
         (pointer)0x0;
    ((local_58[0]._M_head_impl)->pos).startIndex = 0;
    ((local_58[0]._M_head_impl)->pos).endIndex = 0;
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    if (local_58[0]._M_head_impl != (Expr *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_58,
                 (Error<pfederc::SyntaxErrorCode> *)local_58[0]._M_head_impl);
    }
    pLVar8 = this->lexer;
    uVar6 = (ulong)pLVar8->currentToken->type;
    if ((uVar6 < 0x2d) && ((0x100000000006U >> (uVar6 & 0x3f) & 1) != 0)) goto LAB_00112298;
  }
  else {
    pLVar8 = this->lexer;
  }
  Lexer::next(pLVar8);
LAB_00112298:
  parseExpression((Parser *)local_58,(Precedence)this);
  if ((cVar7 != '\0') && (local_58[0]._M_head_impl != (Expr *)0x0)) {
    if (cVar7 == '\x01') {
      requires = ensures;
    }
    std::
    vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
    ::emplace_back<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              ((vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                *)requires,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58);
  }
  if (local_58[0]._M_head_impl != (Expr *)0x0) {
    (*(code *)((pointer)(local_58[0]._M_head_impl)->_vptr_Expr)[1]._M_t.
              super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
              .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>)();
  }
  return;
}

Assistant:

void Parser::parseCapabilityEnsure(std::vector<std::unique_ptr<Expr>> &requires,
    std::vector<std::unique_ptr<Expr>> &ensures) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_ENSURE);

  bool err = false;

  const Token *const tokCmd = lexer.getCurrentToken();
  uint8_t capstype = _CAPS_ENSURE_INVALID;
  if ((capstype = _getCapsEnsure(tokCmd, getLexer())) == _CAPS_ENSURE_INVALID) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_ENSURE, lexer.getCurrentToken()->getPosition()));
    switch (lexer.getCurrentToken()->getType()) {
    case TokenType::TOK_EOF:
    case TokenType::TOK_EOL:
    case TokenType::TOK_STMT:
      break;
    default:
      lexer.next();
      break;
    }

    err = true;
  } else {
    lexer.next();
  }

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr)
    err = true;

  if (err)
    return;

  if (capstype == _CAPS_ENSURE_ENSURES)
    ensures.push_back(std::move(expr));
  else
    requires.push_back(std::move(expr));
}